

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

ps_search_t *
ngram_search_init(char *name,ngram_model_t *lm,cmd_ln_t *config,acmod_t *acmod,dict_t *dict,
                 dict2pid_t *d2p)

{
  int iVar1;
  int32 iVar2;
  int32 iVar3;
  ngram_search_t *ngs_00;
  hmm_context_t *phVar4;
  listelem_alloc_t *plVar5;
  chan_t **ppcVar6;
  int32 *piVar7;
  bitvec_t *pbVar8;
  last_ltrans_t *plVar9;
  long lVar10;
  bptbl_t *pbVar11;
  int32 **ppiVar12;
  ngram_model_t *pnVar13;
  bool local_49;
  ngram_search_t *ngs;
  dict2pid_t *d2p_local;
  dict_t *dict_local;
  acmod_t *acmod_local;
  cmd_ln_t *config_local;
  ngram_model_t *lm_local;
  char *name_local;
  
  config_local = (cmd_ln_t *)lm;
  lm_local = (ngram_model_t *)name;
  iVar1 = ps_config_bool(config,"fwdflat");
  local_49 = false;
  if (iVar1 != 0) {
    iVar1 = ps_config_bool(config,"fwdtree");
    local_49 = iVar1 != 0;
  }
  acmod_set_grow(acmod,(uint)local_49);
  ngs_00 = (ngram_search_t *)
           __ckd_calloc__(1,0x2c8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                          ,0x96);
  ps_search_init((ps_search_t *)ngs_00,&ngram_funcs,"ngram",(char *)lm_local,config,acmod,dict,d2p);
  phVar4 = hmm_context_init(acmod->mdef->n_emit_state,acmod->tmat->tp,(int16 *)0x0,acmod->mdef->sseq
                           );
  ngs_00->hmmctx = phVar4;
  if (ngs_00->hmmctx == (hmm_context_t *)0x0) {
    (*((ngs_00->base).vt)->free)((ps_search_t *)ngs_00);
  }
  else {
    plVar5 = listelem_alloc_init(0x70);
    ngs_00->chan_alloc = plVar5;
    plVar5 = listelem_alloc_init(0x70);
    ngs_00->root_chan_alloc = plVar5;
    plVar5 = listelem_alloc_init(0x48);
    ngs_00->latnode_alloc = plVar5;
    ngram_search_calc_beams(ngs_00);
    ppcVar6 = (chan_t **)
              __ckd_calloc__((long)dict->n_word,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                             ,0xa8);
    ngs_00->word_chan = ppcVar6;
    piVar7 = (int32 *)__ckd_calloc__((long)dict->n_word,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                     ,0xaa);
    ngs_00->word_lat_idx = piVar7;
    pbVar8 = (bitvec_t *)
             __ckd_calloc__((long)((dict->n_word + 0x1f) / 0x20),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                            ,0xab);
    ngs_00->word_active = pbVar8;
    plVar9 = (last_ltrans_t *)
             __ckd_calloc__((long)dict->n_word,0xc,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                            ,0xad);
    ngs_00->last_ltrans = plVar9;
    lVar10 = ps_config_int(config,"latsize");
    ngs_00->bp_table_size = (int32)lVar10;
    pbVar11 = (bptbl_t *)
              __ckd_calloc__((long)ngs_00->bp_table_size,0x24,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                             ,0xb3);
    ngs_00->bp_table = pbVar11;
    ngs_00->bscore_stack_size = ngs_00->bp_table_size * 0x14;
    piVar7 = (int32 *)__ckd_calloc__((long)ngs_00->bscore_stack_size,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                     ,0xb7);
    ngs_00->bscore_stack = piVar7;
    ngs_00->n_frame_alloc = 0x100;
    piVar7 = (int32 *)__ckd_calloc__((long)(ngs_00->n_frame_alloc + 1),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                     ,0xba);
    ngs_00->bp_table_idx = piVar7;
    ngs_00->bp_table_idx = ngs_00->bp_table_idx + 1;
    ppiVar12 = (int32 **)
               __ckd_calloc_2d__(2,(long)dict->n_word,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                 ,0xbf);
    ngs_00->active_word_list = ppiVar12;
    pnVar13 = ngram_model_set_init
                        (config,(ngram_model_t **)&config_local,&ngram_search_init::lmname,
                         (float32 *)0x0,1);
    ngs_00->lmset = pnVar13;
    if (ngs_00->lmset != (ngram_model_t *)0x0) {
      iVar2 = ngram_wid(ngs_00->lmset,"</s>");
      iVar3 = ngram_unknown_wid(ngs_00->lmset);
      if (iVar2 != iVar3) {
        ngram_search_update_widmap(ngs_00);
        iVar1 = ps_config_bool(config,"fwdtree");
        if (iVar1 != 0) {
          ngram_fwdtree_init(ngs_00);
          ngs_00->fwdtree = '\x01';
          (ngs_00->fwdtree_perf).name = "fwdtree";
          ptmr_init(&ngs_00->fwdtree_perf);
        }
        iVar1 = ps_config_bool(config,"fwdflat");
        if (iVar1 != 0) {
          ngram_fwdflat_init(ngs_00);
          ngs_00->fwdflat = '\x01';
          (ngs_00->fwdflat_perf).name = "fwdflat";
          ptmr_init(&ngs_00->fwdflat_perf);
        }
        iVar1 = ps_config_bool(config,"bestpath");
        if (iVar1 == 0) {
          return &ngs_00->base;
        }
        ngs_00->bestpath = '\x01';
        (ngs_00->bestpath_perf).name = "bestpath";
        ptmr_init(&ngs_00->bestpath_perf);
        return &ngs_00->base;
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0xc9,"Language model/set does not contain </s>, recognition will fail\n");
    }
    ngram_search_free((ps_search_t *)ngs_00);
  }
  return (ps_search_t *)0x0;
}

Assistant:

ps_search_t *
ngram_search_init(const char *name,
                  ngram_model_t *lm,
                  cmd_ln_t *config,
                  acmod_t *acmod,
                  dict_t *dict,
                  dict2pid_t *d2p)
{
    ngram_search_t *ngs;
    static char *lmname = "default";

    /* Make the acmod's feature buffer growable if we are doing two-pass
     * search. */
    acmod_set_grow(acmod, ps_config_bool(config, "fwdflat") &&
                          ps_config_bool(config, "fwdtree"));

    ngs = ckd_calloc(1, sizeof(*ngs));
    ps_search_init(&ngs->base, &ngram_funcs, PS_SEARCH_TYPE_NGRAM, name, config, acmod, dict, d2p);

    ngs->hmmctx = hmm_context_init(bin_mdef_n_emit_state(acmod->mdef),
                                   acmod->tmat->tp, NULL, acmod->mdef->sseq);
    if (ngs->hmmctx == NULL) {
        ps_search_free(ps_search_base(ngs));
        return NULL;
    }
    ngs->chan_alloc = listelem_alloc_init(sizeof(chan_t));
    ngs->root_chan_alloc = listelem_alloc_init(sizeof(root_chan_t));
    ngs->latnode_alloc = listelem_alloc_init(sizeof(ps_latnode_t));

    /* Calculate various beam widths and such. */
    ngram_search_calc_beams(ngs);

    /* Allocate a billion different tables for stuff. */
    ngs->word_chan = ckd_calloc(dict_size(dict),
                                sizeof(*ngs->word_chan));
    ngs->word_lat_idx = ckd_calloc(dict_size(dict),
                                   sizeof(*ngs->word_lat_idx));
    ngs->word_active = bitvec_alloc(dict_size(dict));
    ngs->last_ltrans = ckd_calloc(dict_size(dict),
                                  sizeof(*ngs->last_ltrans));

    /* FIXME: All these structures need to be made dynamic with
     * garbage collection. */
    ngs->bp_table_size = ps_config_int(config, "latsize");
    ngs->bp_table = ckd_calloc(ngs->bp_table_size,
                               sizeof(*ngs->bp_table));
    /* FIXME: This thing is frickin' huge. */
    ngs->bscore_stack_size = ngs->bp_table_size * 20;
    ngs->bscore_stack = ckd_calloc(ngs->bscore_stack_size,
                                   sizeof(*ngs->bscore_stack));
    ngs->n_frame_alloc = 256;
    ngs->bp_table_idx = ckd_calloc(ngs->n_frame_alloc + 1,
                                   sizeof(*ngs->bp_table_idx));
    ++ngs->bp_table_idx; /* Make bptableidx[-1] valid */

    /* Allocate active word list array */
    ngs->active_word_list = ckd_calloc_2d(2, dict_size(dict),
                                          sizeof(**ngs->active_word_list));

    ngs->lmset = ngram_model_set_init(config, &lm, &lmname, NULL, 1);
    if (!ngs->lmset)
        goto error_out;

    if (ngram_wid(ngs->lmset, S3_FINISH_WORD) ==
        ngram_unknown_wid(ngs->lmset))
    {
        E_ERROR("Language model/set does not contain </s>, "
                "recognition will fail\n");
        goto error_out;
    }

    /* Create word mappings. */
    ngram_search_update_widmap(ngs);

    /* Initialize fwdtree, fwdflat, bestpath modules if necessary. */
    if (ps_config_bool(config, "fwdtree")) {
        ngram_fwdtree_init(ngs);
        ngs->fwdtree = TRUE;
        ngs->fwdtree_perf.name = "fwdtree";
        ptmr_init(&ngs->fwdtree_perf);
    }
    if (ps_config_bool(config, "fwdflat")) {
        ngram_fwdflat_init(ngs);
        ngs->fwdflat = TRUE;
        ngs->fwdflat_perf.name = "fwdflat";
        ptmr_init(&ngs->fwdflat_perf);
    }
    if (ps_config_bool(config, "bestpath")) {
        ngs->bestpath = TRUE;
        ngs->bestpath_perf.name = "bestpath";
        ptmr_init(&ngs->bestpath_perf);
    }

    return (ps_search_t *)ngs;

error_out:
    ngram_search_free((ps_search_t *)ngs);
    return NULL;
}